

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_stats_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  __m256i alVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256i alVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined4 uVar24;
  ulong uVar25;
  parasail_result_t *ppVar26;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *ptr_04;
  short sVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  char *pcVar31;
  short sVar32;
  int iVar33;
  short sVar34;
  char *__format;
  size_t sVar35;
  uint uVar36;
  ulong uVar37;
  size_t __n;
  short sVar38;
  bool bVar39;
  undefined2 uVar40;
  undefined2 uVar41;
  undefined2 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar53 [16];
  undefined1 auVar49 [32];
  __m256i alVar50;
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [64];
  undefined1 auVar60 [32];
  undefined4 in_stack_fffffffffffffcd8;
  ushort uVar61;
  undefined2 uVar62;
  __m256i *ptr_05;
  __m256i *ptr_06;
  __m256i *ptr_07;
  int local_2ec;
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_118 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar31 = "profile";
  }
  else {
    pvVar7 = (profile->profile16).score;
    if (pvVar7 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar31 = "profile->profile16.score";
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar31 = "profile->matrix";
      }
      else {
        uVar25 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar31 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "open";
        }
        else {
          if (-1 < gap) {
            pvVar9 = (profile->profile16).matches;
            iVar29 = ppVar8->min;
            iVar33 = -iVar29;
            if (iVar29 != -open && SBORROW4(iVar29,-open) == iVar29 + open < 0) {
              iVar33 = open;
            }
            uVar42 = (undefined2)iVar33;
            uVar62 = (undefined2)((uint)iVar33 >> 0x10);
            pvVar10 = (profile->profile16).similar;
            sVar38 = 0x7ffe - (short)ppVar8->max;
            ppVar26 = parasail_result_new_stats();
            if (ppVar26 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            local_218._0_4_ = gap;
            local_1f8._0_4_ = s2Len;
            uVar37 = uVar25 + 0xf >> 4;
            ppVar26->flag = ppVar26->flag | 0x10210404;
            b = parasail_memalign___m256i(0x20,uVar37);
            b_00 = parasail_memalign___m256i(0x20,uVar37);
            b_01 = parasail_memalign___m256i(0x20,uVar37);
            b_02 = parasail_memalign___m256i(0x20,uVar37);
            b_03 = parasail_memalign___m256i(0x20,uVar37);
            b_04 = parasail_memalign___m256i(0x20,uVar37);
            b_05 = parasail_memalign___m256i(0x20,uVar37);
            b_06 = parasail_memalign___m256i(0x20,uVar37);
            ptr = parasail_memalign___m256i(0x20,uVar37);
            ptr_00 = parasail_memalign___m256i(0x20,uVar37);
            ptr_01 = parasail_memalign___m256i(0x20,uVar37);
            ptr_02 = parasail_memalign___m256i(0x20,uVar37);
            ptr_03 = parasail_memalign___m256i(0x20,uVar37);
            ptr_04 = parasail_memalign___m256i(0x20,uVar37);
            auVar48._8_8_ = 0;
            auVar48._0_8_ = b;
            auVar53._8_8_ = 0;
            auVar53._0_8_ = b_00;
            auVar48 = vpunpcklqdq_avx(auVar48,auVar53);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = b_01;
            auVar46._8_8_ = 0;
            auVar46._0_8_ = b_02;
            auVar53 = vpunpcklqdq_avx(auVar43,auVar46);
            auVar43 = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar48;
            auVar46 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
            auVar47._8_8_ = 0;
            auVar47._0_8_ = b_03;
            auVar54._8_8_ = 0;
            auVar54._0_8_ = b_04;
            auVar48 = vpunpcklqdq_avx(auVar47,auVar54);
            auVar55._8_8_ = 0;
            auVar55._0_8_ = b_05;
            auVar56._8_8_ = 0;
            auVar56._0_8_ = b_06;
            auVar53 = vpunpcklqdq_avx(auVar55,auVar56);
            auVar48 = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar48;
            auVar53 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
            auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 0);
            auVar44._8_8_ = -(ulong)(auVar43._8_8_ == 0);
            auVar44._16_8_ = -(ulong)(auVar46._0_8_ == 0);
            auVar44._24_8_ = -(ulong)(auVar46._8_8_ == 0);
            auVar49._0_8_ = -(ulong)(auVar48._0_8_ == 0);
            auVar49._8_8_ = -(ulong)(auVar48._8_8_ == 0);
            auVar49._16_8_ = -(ulong)(auVar53._0_8_ == 0);
            auVar49._24_8_ = -(ulong)(auVar53._8_8_ == 0);
            auVar44 = vpackssdw_avx2(auVar44,auVar49);
            if ((((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar44 >> 0x7f,0) != '\0') ||
                  (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar44 >> 0xbf,0) != '\0') ||
                (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar44[0x1f] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_03 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_04 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar40 = (undefined2)open;
            uVar41 = (undefined2)gap;
            uVar21 = CONCAT22(uVar62,uVar42) - 0x7fff;
            uVar42 = (undefined2)uVar21;
            uVar36 = (uint)uVar37;
            auVar45._0_2_ = (undefined2)uVar37;
            auVar45._2_2_ = auVar45._0_2_;
            auVar45._4_2_ = auVar45._0_2_;
            auVar45._6_2_ = auVar45._0_2_;
            auVar45._8_2_ = auVar45._0_2_;
            auVar45._10_2_ = auVar45._0_2_;
            auVar45._12_2_ = auVar45._0_2_;
            auVar45._14_2_ = auVar45._0_2_;
            auVar45._16_2_ = auVar45._0_2_;
            auVar45._18_2_ = auVar45._0_2_;
            auVar45._20_2_ = auVar45._0_2_;
            auVar45._22_2_ = auVar45._0_2_;
            auVar45._24_2_ = auVar45._0_2_;
            auVar45._26_2_ = auVar45._0_2_;
            auVar45._28_2_ = auVar45._0_2_;
            auVar45._30_2_ = auVar45._0_2_;
            auVar49 = vperm2i128_avx2(auVar45,auVar45,0x28);
            uVar22 = uVar21 & 0xffff;
            auVar51._0_2_ = (undefined2)-(gap * uVar36);
            auVar51._2_2_ = auVar51._0_2_;
            auVar51._4_2_ = auVar51._0_2_;
            auVar51._6_2_ = auVar51._0_2_;
            auVar51._8_2_ = auVar51._0_2_;
            auVar51._10_2_ = auVar51._0_2_;
            auVar51._12_2_ = auVar51._0_2_;
            auVar51._14_2_ = auVar51._0_2_;
            auVar51._16_2_ = auVar51._0_2_;
            auVar51._18_2_ = auVar51._0_2_;
            auVar51._20_2_ = auVar51._0_2_;
            auVar51._22_2_ = auVar51._0_2_;
            auVar51._24_2_ = auVar51._0_2_;
            auVar51._26_2_ = auVar51._0_2_;
            auVar51._28_2_ = auVar51._0_2_;
            auVar51._30_2_ = auVar51._0_2_;
            auVar44 = vpand_avx2(auVar51,_DAT_008a5920);
            auVar44 = vpaddsw_avx2(ZEXT432(uVar22),auVar44);
            alVar11[0]._4_2_ = uVar42;
            alVar11[0]._0_4_ = in_stack_fffffffffffffcd8;
            alVar11[0]._6_2_ = (short)(uVar21 >> 0x10);
            alVar11[1] = (longlong)b_01;
            alVar11[2] = (longlong)b_00;
            alVar11[3] = (longlong)b;
            parasail_memset___m256i(b_03,alVar11,uVar37);
            alVar18[0]._4_2_ = (short)uVar21;
            alVar18[0]._0_4_ = in_stack_fffffffffffffcd8;
            alVar18[0]._6_2_ = (short)(uVar21 >> 0x10);
            alVar18[1] = (longlong)b_01;
            alVar18[2] = (longlong)b_00;
            alVar18[3] = (longlong)b;
            parasail_memset___m256i(b_04,alVar18,uVar37);
            alVar1[0]._4_2_ = (short)uVar21;
            alVar1[0]._0_4_ = in_stack_fffffffffffffcd8;
            alVar1[0]._6_2_ = (short)(uVar21 >> 0x10);
            alVar1[1] = (longlong)b_01;
            alVar1[2] = (longlong)b_00;
            alVar1[3] = (longlong)b;
            parasail_memset___m256i(b_05,alVar1,uVar37);
            alVar2[0]._4_2_ = (short)uVar21;
            alVar2[0]._0_4_ = in_stack_fffffffffffffcd8;
            alVar2[0]._6_2_ = (short)(uVar21 >> 0x10);
            alVar2[1] = (longlong)b_01;
            alVar2[2] = (longlong)b_00;
            alVar2[3] = (longlong)b;
            parasail_memset___m256i(b_06,alVar2,uVar37);
            c[0]._4_2_ = (short)uVar21;
            c[0]._0_4_ = in_stack_fffffffffffffcd8;
            c[0]._6_2_ = (short)(uVar21 >> 0x10);
            c[1] = (longlong)b_01;
            c[2] = (longlong)b_00;
            c[3] = (longlong)b;
            parasail_memset___m256i(b,c,uVar37);
            c_00[0]._4_2_ = (short)uVar21;
            c_00[0]._0_4_ = in_stack_fffffffffffffcd8;
            c_00[0]._6_2_ = (short)(uVar21 >> 0x10);
            c_00[1] = (longlong)b_01;
            c_00[2] = (longlong)b_00;
            c_00[3] = (longlong)b;
            parasail_memset___m256i(b_00,c_00,uVar37);
            c_01[0]._4_2_ = (short)uVar21;
            c_01[0]._0_4_ = in_stack_fffffffffffffcd8;
            c_01[0]._6_2_ = (short)(uVar21 >> 0x10);
            c_01[1] = (longlong)b_01;
            c_01[2] = (longlong)b_00;
            c_01[3] = (longlong)b;
            parasail_memset___m256i(b_01,c_01,uVar37);
            c_02[0]._4_2_ = (short)uVar21;
            c_02[0]._0_4_ = in_stack_fffffffffffffcd8;
            c_02[0]._6_2_ = (short)(uVar21 >> 0x10);
            c_02[1] = (longlong)b_01;
            c_02[2] = (longlong)b_00;
            c_02[3] = (longlong)b;
            parasail_memset___m256i(b_02,c_02,uVar37);
            auVar15._2_2_ = uVar40;
            auVar15._0_2_ = uVar40;
            auVar15._4_2_ = uVar40;
            auVar15._6_2_ = uVar40;
            auVar15._8_2_ = uVar40;
            auVar15._10_2_ = uVar40;
            auVar15._12_2_ = uVar40;
            auVar15._14_2_ = uVar40;
            auVar15._16_2_ = uVar40;
            auVar15._18_2_ = uVar40;
            auVar15._20_2_ = uVar40;
            auVar15._22_2_ = uVar40;
            auVar15._24_2_ = uVar40;
            auVar15._26_2_ = uVar40;
            auVar15._28_2_ = uVar40;
            auVar15._30_2_ = uVar40;
            alVar18 = (__m256i)vpsubsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar15);
            alVar50[1]._0_2_ = 1;
            alVar50[0] = 0x1000100010001;
            alVar50[1]._2_2_ = 1;
            alVar50[1]._4_2_ = 1;
            alVar50[1]._6_2_ = 1;
            alVar50[2]._0_2_ = 1;
            alVar50[2]._2_2_ = 1;
            alVar50[2]._4_2_ = 1;
            alVar50[2]._6_2_ = 1;
            alVar50[3]._0_2_ = 1;
            alVar50[3]._2_2_ = 1;
            alVar50[3]._4_2_ = 1;
            alVar50[3]._6_2_ = 1;
            uVar23 = uVar36 - 1;
            alVar11 = alVar50;
            for (uVar28 = uVar23; -1 < (int)uVar28; uVar28 = uVar28 - 1) {
              ptr_03[uVar28] = alVar18;
              ptr_04[uVar28] = alVar11;
              auVar20._2_2_ = uVar41;
              auVar20._0_2_ = uVar41;
              auVar20._4_2_ = uVar41;
              auVar20._6_2_ = uVar41;
              auVar20._8_2_ = uVar41;
              auVar20._10_2_ = uVar41;
              auVar20._12_2_ = uVar41;
              auVar20._14_2_ = uVar41;
              auVar20._16_2_ = uVar41;
              auVar20._18_2_ = uVar41;
              auVar20._20_2_ = uVar41;
              auVar20._22_2_ = uVar41;
              auVar20._24_2_ = uVar41;
              auVar20._26_2_ = uVar41;
              auVar20._28_2_ = uVar41;
              auVar20._30_2_ = uVar41;
              alVar18 = (__m256i)vpsubsw_avx2((undefined1  [32])alVar18,auVar20);
              alVar11 = (__m256i)vpaddsw_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar50);
            }
            auVar49 = vpalignr_avx2(auVar45,auVar49,0xe);
            __n = uVar37 << 5;
            auVar17._2_2_ = sVar38;
            auVar17._0_2_ = sVar38;
            auVar17._4_2_ = sVar38;
            auVar17._6_2_ = sVar38;
            auVar17._8_2_ = sVar38;
            auVar17._10_2_ = sVar38;
            auVar17._12_2_ = sVar38;
            auVar17._14_2_ = sVar38;
            auVar17._16_2_ = sVar38;
            auVar17._18_2_ = sVar38;
            auVar17._20_2_ = sVar38;
            auVar17._22_2_ = sVar38;
            auVar17._24_2_ = sVar38;
            auVar17._26_2_ = sVar38;
            auVar17._28_2_ = sVar38;
            auVar17._30_2_ = sVar38;
            auVar16._2_2_ = uVar42;
            auVar16._0_2_ = uVar42;
            auVar16._4_2_ = uVar42;
            auVar16._6_2_ = uVar42;
            auVar16._8_2_ = uVar42;
            auVar16._10_2_ = uVar42;
            auVar16._12_2_ = uVar42;
            auVar16._14_2_ = uVar42;
            auVar16._16_2_ = uVar42;
            auVar16._18_2_ = uVar42;
            auVar16._20_2_ = uVar42;
            auVar16._22_2_ = uVar42;
            auVar16._24_2_ = uVar42;
            auVar16._26_2_ = uVar42;
            auVar16._28_2_ = uVar42;
            auVar16._30_2_ = uVar42;
            local_2ec = 0;
            auVar15 = auVar16;
            ptr_05 = b_01;
            ptr_06 = b_00;
            ptr_07 = b;
            local_d8 = auVar16;
            for (uVar37 = 0; uVar37 != (uint)s2Len; uVar37 = uVar37 + 1) {
              alVar11 = b_03[uVar23];
              alVar18 = b_04[uVar23];
              alVar1 = b_05[uVar23];
              alVar2 = b_06[uVar23];
              auVar45 = vperm2i128_avx2((undefined1  [32])alVar11,(undefined1  [32])alVar11,0x28);
              auVar45 = vpalignr_avx2((undefined1  [32])alVar11,auVar45,0xe);
              auVar51 = vperm2i128_avx2((undefined1  [32])alVar18,(undefined1  [32])alVar18,0x28);
              auVar51 = vpalignr_avx2((undefined1  [32])alVar18,auVar51,0xe);
              auVar20 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar20 = vpalignr_avx2((undefined1  [32])alVar1,auVar20,0xe);
              auVar52 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28);
              auVar52 = vpalignr_avx2((undefined1  [32])alVar2,auVar52,0xe);
              lVar30 = (long)(int)(ppVar8->mapper[(byte)s2[uVar37]] * uVar36) * 0x20;
              local_288 = ZEXT1632(ZEXT816(0));
              auVar59 = ZEXT1664((undefined1  [16])0x0);
              auVar14._2_2_ = uVar42;
              auVar14._0_2_ = uVar42;
              auVar14._4_2_ = uVar42;
              auVar14._6_2_ = uVar42;
              auVar14._8_2_ = uVar42;
              auVar14._10_2_ = uVar42;
              auVar14._12_2_ = uVar42;
              auVar14._14_2_ = uVar42;
              auVar14._16_2_ = uVar42;
              auVar14._18_2_ = uVar42;
              auVar14._20_2_ = uVar42;
              auVar14._22_2_ = uVar42;
              auVar14._24_2_ = uVar42;
              auVar14._26_2_ = uVar42;
              auVar14._28_2_ = uVar42;
              auVar14._30_2_ = uVar42;
              local_118 = ZEXT1632(ZEXT816(0));
              local_2a8 = ZEXT1632(ZEXT816(0));
              for (sVar35 = 0; auVar58 = auVar59._0_32_, __n != sVar35; sVar35 = sVar35 + 0x20) {
                auVar3 = *(undefined1 (*) [32])((long)*b_03 + sVar35);
                auVar4 = *(undefined1 (*) [32])((long)*b_04 + sVar35);
                auVar5 = *(undefined1 (*) [32])((long)*b_05 + sVar35);
                auVar6 = *(undefined1 (*) [32])((long)*b_06 + sVar35);
                auVar58 = vpaddsw_avx2(auVar58,*(undefined1 (*) [32])((long)*ptr_03 + sVar35));
                auVar13 = vpcmpgtw_avx2(auVar58,auVar14);
                local_288 = vpblendvb_avx2(local_288,local_b8,auVar13);
                local_118 = vpblendvb_avx2(local_118,local_1f8,auVar13);
                auVar12 = vpaddsw_avx2(local_218,*(undefined1 (*) [32])((long)*ptr_04 + sVar35));
                local_2a8 = vpblendvb_avx2(local_2a8,auVar12,auVar13);
                auVar12._2_2_ = uVar40;
                auVar12._0_2_ = uVar40;
                auVar12._4_2_ = uVar40;
                auVar12._6_2_ = uVar40;
                auVar12._8_2_ = uVar40;
                auVar12._10_2_ = uVar40;
                auVar12._12_2_ = uVar40;
                auVar12._14_2_ = uVar40;
                auVar12._16_2_ = uVar40;
                auVar12._18_2_ = uVar40;
                auVar12._20_2_ = uVar40;
                auVar12._22_2_ = uVar40;
                auVar12._24_2_ = uVar40;
                auVar12._26_2_ = uVar40;
                auVar12._28_2_ = uVar40;
                auVar12._30_2_ = uVar40;
                auVar19 = vpsubsw_avx2(auVar3,auVar12);
                auVar13._2_2_ = uVar41;
                auVar13._0_2_ = uVar41;
                auVar13._4_2_ = uVar41;
                auVar13._6_2_ = uVar41;
                auVar13._8_2_ = uVar41;
                auVar13._10_2_ = uVar41;
                auVar13._12_2_ = uVar41;
                auVar13._14_2_ = uVar41;
                auVar13._16_2_ = uVar41;
                auVar13._18_2_ = uVar41;
                auVar13._20_2_ = uVar41;
                auVar13._22_2_ = uVar41;
                auVar13._24_2_ = uVar41;
                auVar13._26_2_ = uVar41;
                auVar13._28_2_ = uVar41;
                auVar13._30_2_ = uVar41;
                auVar60 = vpsubsw_avx2(*(undefined1 (*) [32])((long)*b + sVar35),auVar13);
                auVar12 = vpcmpgtw_avx2(auVar19,auVar60);
                auVar13 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + sVar35),auVar4,auVar12
                                        );
                auVar57 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + sVar35),auVar5,auVar12
                                        );
                auVar19 = vpmaxsw_avx2(auVar19,auVar60);
                auVar60._8_2_ = 1;
                auVar60._0_8_ = 0x1000100010001;
                auVar60._10_2_ = 1;
                auVar60._12_2_ = 1;
                auVar60._14_2_ = 1;
                auVar60._16_2_ = 1;
                auVar60._18_2_ = 1;
                auVar60._20_2_ = 1;
                auVar60._22_2_ = 1;
                auVar60._24_2_ = 1;
                auVar60._26_2_ = 1;
                auVar60._28_2_ = 1;
                auVar60._30_2_ = 1;
                auVar12 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + sVar35),auVar6,auVar12
                                        );
                auVar52 = vpaddsw_avx2(auVar60,auVar52);
                auVar12 = vpaddsw_avx2(auVar60,auVar12);
                auVar45 = vpaddsw_avx2(auVar45,*(undefined1 (*) [32])
                                                ((long)pvVar7 + sVar35 + lVar30));
                auVar51 = vpaddsw_avx2(auVar51,*(undefined1 (*) [32])
                                                ((long)pvVar9 + sVar35 + lVar30));
                auVar20 = vpaddsw_avx2(auVar20,*(undefined1 (*) [32])
                                                ((long)pvVar10 + sVar35 + lVar30));
                auVar14 = vpmaxsw_avx2(auVar58,auVar14);
                auVar58 = vpcmpgtw_avx2(auVar19,auVar45);
                *(undefined1 (*) [32])((long)*b + sVar35) = auVar19;
                *(undefined1 (*) [32])((long)*b_00 + sVar35) = auVar13;
                local_b8 = vpblendvb_avx2(auVar51,auVar13,auVar58);
                *(undefined1 (*) [32])((long)*b_01 + sVar35) = auVar57;
                local_1f8 = vpblendvb_avx2(auVar20,auVar57,auVar58);
                local_218 = vpblendvb_avx2(auVar52,auVar12,auVar58);
                *(undefined1 (*) [32])((long)*b_02 + sVar35) = auVar12;
                *(undefined1 (*) [32])((long)*b_03 + sVar35) = auVar45;
                *(undefined1 (*) [32])((long)*b_04 + sVar35) = auVar51;
                *(undefined1 (*) [32])((long)*b_05 + sVar35) = auVar20;
                auVar45 = vpmaxsw_avx2(auVar19,auVar45);
                auVar59 = ZEXT3264(auVar45);
                *(undefined1 (*) [32])((long)*b_06 + sVar35) = auVar52;
                auVar45 = auVar3;
                auVar51 = auVar4;
                auVar20 = auVar5;
                auVar52 = auVar6;
              }
              auVar45 = vperm2i128_avx2(auVar58,auVar58,0x28);
              auVar51 = vpalignr_avx2(auVar58,auVar45,0xe);
              auVar45 = vperm2i128_avx2(local_b8,local_b8,0x28);
              local_b8 = vpalignr_avx2(local_b8,auVar45,0xe);
              auVar45 = vperm2i128_avx2(local_1f8,local_1f8,0x28);
              local_1f8 = vpalignr_avx2(local_1f8,auVar45,0xe);
              auVar45 = vperm2i128_avx2(local_218,local_218,0x28);
              local_218 = vpalignr_avx2(local_218,auVar45,0xe);
              auVar45 = vpaddsw_avx2(auVar51,(undefined1  [32])*ptr_03);
              auVar58 = vpcmpgtw_avx2(auVar14,auVar45);
              auVar14 = vpmaxsw_avx2(auVar14,auVar45);
              auVar52 = vpblendvb_avx2(local_b8,local_288,auVar58);
              auVar20 = vpblendvb_avx2(local_1f8,local_118,auVar58);
              auVar45 = vpaddsw_avx2(local_218,(undefined1  [32])*ptr_04);
              auVar45 = vpblendvb_avx2(auVar45,local_2a8,auVar58);
              iVar29 = 0xe;
              while( true ) {
                auVar58 = vperm2i128_avx2(auVar14,auVar14,0x28);
                auVar3 = vperm2i128_avx2(auVar52,auVar52,0x28);
                auVar4 = vperm2i128_avx2(auVar20,auVar20,0x28);
                auVar5 = vperm2i128_avx2(auVar45,auVar45,0x28);
                bVar39 = iVar29 == 0;
                iVar29 = iVar29 + -1;
                if (bVar39) break;
                auVar58 = vpalignr_avx2(auVar14,auVar58,0xe);
                auVar58 = vpaddsw_avx2(auVar44,auVar58);
                auVar6 = vpcmpgtw_avx2(auVar14,auVar58);
                auVar3 = vpalignr_avx2(auVar52,auVar3,0xe);
                auVar52 = vpblendvb_avx2(auVar3,auVar52,auVar6);
                auVar14 = vpmaxsw_avx2(auVar14,auVar58);
                auVar58 = vpalignr_avx2(auVar20,auVar4,0xe);
                auVar20 = vpblendvb_avx2(auVar58,auVar20,auVar6);
                auVar58 = vpalignr_avx2(auVar45,auVar5,0xe);
                auVar58 = vpaddsw_avx2(auVar58,auVar49);
                auVar45 = vpblendvb_avx2(auVar58,auVar45,auVar6);
              }
              auVar14 = vpalignr_avx2(auVar14,auVar58,0xe);
              auVar14 = vpaddsw_avx2(auVar14,ZEXT432(uVar22));
              auVar6 = vpcmpgtw_avx2(auVar14,auVar51);
              auVar52 = vpalignr_avx2(auVar52,auVar3,0xe);
              auVar58 = vpblendvb_avx2(local_b8,auVar52,auVar6);
              auVar12 = vpmaxsw_avx2(auVar14,auVar51);
              auVar51 = vpalignr_avx2(auVar20,auVar4,0xe);
              auVar20 = vpblendvb_avx2(local_1f8,auVar51,auVar6);
              auVar45 = vpalignr_avx2(auVar45,auVar5,0xe);
              auVar3 = vpblendvb_avx2(local_218,auVar45,auVar6);
              for (sVar35 = 0; __n != sVar35; sVar35 = sVar35 + 0x20) {
                auVar4 = *(undefined1 (*) [32])((long)*b_03 + sVar35);
                auVar5._2_2_ = uVar40;
                auVar5._0_2_ = uVar40;
                auVar5._4_2_ = uVar40;
                auVar5._6_2_ = uVar40;
                auVar5._8_2_ = uVar40;
                auVar5._10_2_ = uVar40;
                auVar5._12_2_ = uVar40;
                auVar5._14_2_ = uVar40;
                auVar5._16_2_ = uVar40;
                auVar5._18_2_ = uVar40;
                auVar5._20_2_ = uVar40;
                auVar5._22_2_ = uVar40;
                auVar5._24_2_ = uVar40;
                auVar5._26_2_ = uVar40;
                auVar5._28_2_ = uVar40;
                auVar5._30_2_ = uVar40;
                auVar5 = vpsubsw_avx2(auVar12,auVar5);
                auVar6._2_2_ = uVar41;
                auVar6._0_2_ = uVar41;
                auVar6._4_2_ = uVar41;
                auVar6._6_2_ = uVar41;
                auVar6._8_2_ = uVar41;
                auVar6._10_2_ = uVar41;
                auVar6._12_2_ = uVar41;
                auVar6._14_2_ = uVar41;
                auVar6._16_2_ = uVar41;
                auVar6._18_2_ = uVar41;
                auVar6._20_2_ = uVar41;
                auVar6._22_2_ = uVar41;
                auVar6._24_2_ = uVar41;
                auVar6._26_2_ = uVar41;
                auVar6._28_2_ = uVar41;
                auVar6._30_2_ = uVar41;
                auVar6 = vpsubsw_avx2(auVar14,auVar6);
                auVar14 = vpcmpgtw_avx2(auVar5,auVar6);
                auVar52 = vpblendvb_avx2(auVar52,auVar58,auVar14);
                auVar51 = vpblendvb_avx2(auVar51,auVar20,auVar14);
                auVar45 = vpblendvb_avx2(auVar45,auVar3,auVar14);
                auVar14 = vpmaxsw_avx2(auVar5,auVar6);
                auVar57._8_2_ = 1;
                auVar57._0_8_ = 0x1000100010001;
                auVar57._10_2_ = 1;
                auVar57._12_2_ = 1;
                auVar57._14_2_ = 1;
                auVar57._16_2_ = 1;
                auVar57._18_2_ = 1;
                auVar57._20_2_ = 1;
                auVar57._22_2_ = 1;
                auVar57._24_2_ = 1;
                auVar57._26_2_ = 1;
                auVar57._28_2_ = 1;
                auVar57._30_2_ = 1;
                auVar45 = vpaddsw_avx2(auVar45,auVar57);
                auVar20 = vpmaxsw_avx2(auVar4,*(undefined1 (*) [32])((long)*b + sVar35));
                auVar6 = vpmaxsw_avx2(auVar20,auVar14);
                auVar12 = vpmaxsw_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar6);
                auVar3 = vpcmpeqw_avx2(auVar12,auVar14);
                auVar20 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_00 + sVar35),auVar52,auVar3
                                        );
                auVar58 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_01 + sVar35),auVar51,auVar3
                                        );
                auVar3 = vpblendvb_avx2(*(undefined1 (*) [32])((long)*b_02 + sVar35),auVar45,auVar3)
                ;
                auVar5 = vpcmpeqw_avx2(auVar4,auVar12);
                auVar20 = vpblendvb_avx2(auVar20,*(undefined1 (*) [32])((long)*b_04 + sVar35),auVar5
                                        );
                auVar4 = vpblendvb_avx2(auVar58,*(undefined1 (*) [32])((long)*b_05 + sVar35),auVar5)
                ;
                auVar3 = vpblendvb_avx2(auVar3,*(undefined1 (*) [32])((long)*b_06 + sVar35),auVar5);
                auVar5 = vpcmpgtw_avx2(auVar57,auVar6);
                auVar58 = vpandn_avx2(auVar5,auVar20);
                auVar20 = vpandn_avx2(auVar5,auVar4);
                auVar3 = vpandn_avx2(auVar5,auVar3);
                *(undefined1 (*) [32])((long)*b_03 + sVar35) = auVar12;
                *(undefined1 (*) [32])((long)*b_04 + sVar35) = auVar58;
                *(undefined1 (*) [32])((long)*b_05 + sVar35) = auVar20;
                *(undefined1 (*) [32])((long)*b_06 + sVar35) = auVar3;
                auVar15 = vpmaxsw_avx2(auVar15,auVar12);
                auVar15 = vpmaxsw_avx2(auVar15,auVar58);
                auVar4 = vpmaxsw_avx2(auVar20,auVar3);
                auVar15 = vpmaxsw_avx2(auVar15,auVar4);
                auVar17 = vpminsw_avx2(auVar17,auVar12);
                auVar16 = vpmaxsw_avx2(auVar16,auVar12);
              }
              auVar45 = vpcmpgtw_avx2(auVar16,local_d8);
              if ((((((((((((((((((((((((((((((((auVar45 >> 7 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0 ||
                                               (auVar45 >> 0xf & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar45 >> 0x17 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar45 >> 0x1f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar45 >> 0x27 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar45 >> 0x2f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar45 >> 0x37 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar45 >> 0x3f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar45 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar45 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar45 >> 0x57 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar45 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar45 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar45 >> 0x6f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar45 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || SUB321(auVar45 >> 0x7f,0) != '\0') ||
                                (auVar45 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar45 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar45 >> 0x97 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar45 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar45 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar45 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar45 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar45 >> 0xbf,0) != '\0') ||
                        (auVar45 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar45 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar45 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar45 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar45 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar45 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar45 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  auVar45[0x1f] < '\0') {
                auVar45 = vpermq_avx2(auVar16,0x44);
                auVar45 = vpmaxsw_avx2(auVar16,auVar45);
                auVar51 = vpslldq_avx2(auVar45,8);
                auVar45 = vpmaxsw_avx2(auVar45,auVar51);
                auVar51 = vpslldq_avx2(auVar45,4);
                auVar45 = vpmaxsw_avx2(auVar45,auVar51);
                auVar51 = vpslldq_avx2(auVar45,2);
                auVar45 = vpmaxsw_avx2(auVar45,auVar51);
                uVar24 = vpextrw_avx(auVar45._16_16_,7);
                uVar61 = (ushort)uVar24;
                auVar45 = vpshufhw_avx2(auVar45,0xff);
                auVar52._8_4_ = 6;
                auVar52._0_8_ = 0x600000006;
                auVar52._12_4_ = 6;
                auVar52._16_4_ = 6;
                auVar52._20_4_ = 6;
                auVar52._24_4_ = 6;
                auVar52._28_4_ = 6;
                local_d8 = vpermd_avx2(auVar52,auVar45);
                memcpy(ptr,b_03,__n);
                memcpy(ptr_00,b_04,__n);
                memcpy(ptr_01,b_05,__n);
                b_01 = ptr_05;
                b_00 = ptr_06;
                b = ptr_07;
                memcpy(ptr_02,b_06,__n);
                uVar21 = (uint)uVar61;
                local_2ec = (int)uVar37;
                ptr_05 = b_01;
                ptr_06 = b_00;
                ptr_07 = b;
              }
            }
            uVar37 = 0;
            sVar27 = 0;
            sVar32 = 0;
            sVar34 = 0;
            while( true ) {
              iVar29 = (int)uVar25;
              if ((uVar36 & 0x7ffffff) << 4 == (uint)uVar37) break;
              if ((*(short *)((long)*ptr + uVar37 * 2) == (short)uVar21) &&
                 (uVar28 = ((uint)uVar37 & 0xf) * uVar36 + ((uint)(uVar37 >> 4) & 0xfffffff),
                 (int)uVar28 < iVar29)) {
                sVar27 = *(short *)((long)*ptr_00 + uVar37 * 2);
                sVar32 = *(short *)((long)*ptr_01 + uVar37 * 2);
                sVar34 = *(short *)((long)*ptr_02 + uVar37 * 2);
                uVar25 = (ulong)uVar28;
              }
              uVar37 = uVar37 + 1;
            }
            auVar58._2_2_ = uVar42;
            auVar58._0_2_ = uVar42;
            auVar58._4_2_ = uVar42;
            auVar58._6_2_ = uVar42;
            auVar58._8_2_ = uVar42;
            auVar58._10_2_ = uVar42;
            auVar58._12_2_ = uVar42;
            auVar58._14_2_ = uVar42;
            auVar58._16_2_ = uVar42;
            auVar58._18_2_ = uVar42;
            auVar58._20_2_ = uVar42;
            auVar58._22_2_ = uVar42;
            auVar58._24_2_ = uVar42;
            auVar58._26_2_ = uVar42;
            auVar58._28_2_ = uVar42;
            auVar58._30_2_ = uVar42;
            auVar44 = vpcmpgtw_avx2(auVar58,auVar17);
            auVar3._2_2_ = sVar38;
            auVar3._0_2_ = sVar38;
            auVar3._4_2_ = sVar38;
            auVar3._6_2_ = sVar38;
            auVar3._8_2_ = sVar38;
            auVar3._10_2_ = sVar38;
            auVar3._12_2_ = sVar38;
            auVar3._14_2_ = sVar38;
            auVar3._16_2_ = sVar38;
            auVar3._18_2_ = sVar38;
            auVar3._20_2_ = sVar38;
            auVar3._22_2_ = sVar38;
            auVar3._24_2_ = sVar38;
            auVar3._26_2_ = sVar38;
            auVar3._28_2_ = sVar38;
            auVar3._30_2_ = sVar38;
            auVar49 = vpcmpgtw_avx2(auVar15,auVar3);
            auVar44 = vpor_avx2(auVar49,auVar44);
            if ((((((((((((((((((((((((((((((((auVar44 >> 7 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0 ||
                                             (auVar44 >> 0xf & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar44 >> 0x17 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar44 >> 0x1f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar44 >> 0x27 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar44 >> 0x2f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar44 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar44 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar44 >> 0x47 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar44 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar44 >> 0x57 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar44 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar44 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar44 >> 0x6f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar44 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar44 >> 0x7f,0) != '\0') ||
                              (auVar44 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar44 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar44 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar44 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar44 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar44 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar44 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar44 >> 0xbf,0) != '\0') ||
                      (auVar44 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar44 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar44 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar44 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar44 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar44 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar44 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                auVar44[0x1f] < '\0') {
              *(byte *)&ppVar26->flag = (byte)ppVar26->flag | 0x40;
              uVar21 = 0;
              sVar27 = 0;
              sVar32 = 0;
              sVar34 = 0;
              local_2ec = 0;
              iVar29 = 0;
            }
            ppVar26->score = (int)(short)uVar21;
            ppVar26->end_query = iVar29;
            ppVar26->end_ref = local_2ec;
            *(int *)(ppVar26->field_4).extra = (int)sVar27;
            ((ppVar26->field_4).stats)->similar = (int)sVar32;
            ((ppVar26->field_4).stats)->length = (int)sVar34;
            parasail_free(ptr_04);
            parasail_free(ptr_03);
            parasail_free(ptr_02);
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(ptr_05);
            parasail_free(ptr_06);
            parasail_free(ptr_07);
            return ppVar26;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_stats_scan_profile_avx2_256_16",pcVar31);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile16.score;
    pvPm = (__m256i*)profile->profile16.matches;
    pvPs = (__m256i*)profile->profile16.similar;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
            vGapperL = _mm256_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        vHpM = _mm256_slli_si256_rpl(vHpM, 2);
        vHpS = _mm256_slli_si256_rpl(vHpS, 2);
        vHpL = _mm256_slli_si256_rpl(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_subs_epi16(vH, vGapO);
            vE_ext = _mm256_subs_epi16(vE, vGapE);
            case1 = _mm256_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm256_max_epi16(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_adds_epi16(vEL, vOne);
            vGapper = _mm256_adds_epi16(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vF, vGapper),
                    _mm256_cmpeq_epi16(vF, vGapper));
            vF = _mm256_max_epi16(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_adds_epi16(vHp, vW);
            vHpM = _mm256_adds_epi16(vHpM, vWM);
            vHpS = _mm256_adds_epi16(vHpS, vWS);
            vHpL = _mm256_adds_epi16(vHpL, vOne);
            case1 = _mm256_cmpgt_epi16(vE, vHp);
            vHt = _mm256_max_epi16(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vHtM = _mm256_slli_si256_rpl(vHtM, 2);
        vHtS = _mm256_slli_si256_rpl(vHtS, 2);
        vHtL = _mm256_slli_si256_rpl(vHtL, 2);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_adds_epi16(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi16(vGapper, vF),
                _mm256_cmpeq_epi16(vGapper, vF));
        vF = _mm256_max_epi16(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 2);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 2);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi16(vFt, vF),
                    _mm256_cmpeq_epi16(vFt, vF));
            vF = _mm256_max_epi16(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vFM = _mm256_slli_si256_rpl(vFM, 2);
        vFS = _mm256_slli_si256_rpl(vFS, 2);
        vFL = _mm256_slli_si256_rpl(vFL, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi16(vF, vHt);
        vH = _mm256_max_epi16(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_subs_epi16(vH, vGapO);
            vF_ext = _mm256_subs_epi16(vF, vGapE);
            vF = _mm256_max_epi16(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_adds_epi16(vFL, vOne);
            vH = _mm256_max_epi16(vHp, vE);
            vH = _mm256_max_epi16(vH, vF);
            vH = _mm256_max_epi16(vH, vZero);
            case1 = _mm256_cmpeq_epi16(vH, vHp);
            case2 = _mm256_cmpeq_epi16(vH, vF);
            case0 = _mm256_cmpeq_epi16(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm256_max_epi16(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
                vHM = _mm256_slli_si256_rpl(vHM, 2);
                vHS = _mm256_slli_si256_rpl(vHS, 2);
                vHL = _mm256_slli_si256_rpl(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHM, 15);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHS, 15);
            result->stats->rowcols->length_row[j] = (int16_t) _mm256_extract_epi16_rpl (vHL, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}